

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O2

void audio_make_sane(int *ndev,int *devvec,int *nchan,int *chanvec,int maxdev)

{
  int iVar1;
  ulong uVar2;
  int iVar4;
  long lVar3;
  
  iVar1 = *ndev;
  uVar2 = (ulong)iVar1;
  iVar4 = *nchan;
  if (uVar2 == 0xffffffffffffffff) {
    if (iVar4 == -1) {
      *nchan = 0;
      iVar4 = 0;
    }
    else {
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        devvec[lVar3] = (int)lVar3;
      }
LAB_0016a31b:
      iVar4 = *nchan;
    }
  }
  else {
    if (iVar4 == -1) {
      *nchan = iVar1;
      for (lVar3 = 0; iVar1 = *ndev, lVar3 < iVar1; lVar3 = lVar3 + 1) {
        chanvec[lVar3] = 2;
      }
      goto LAB_0016a32c;
    }
    if (iVar4 <= iVar1) {
      if (iVar1 <= iVar4) goto LAB_0016a32c;
      for (lVar3 = (long)iVar4; lVar3 < (int)uVar2; lVar3 = lVar3 + 1) {
        if (lVar3 == 0) {
          *chanvec = 2;
        }
        else {
          chanvec[lVar3] = chanvec[lVar3 + -1];
        }
        uVar2 = (ulong)(uint)*ndev;
      }
      goto LAB_0016a31b;
    }
    for (; (long)uVar2 < (long)iVar4; uVar2 = uVar2 + 1) {
      if (uVar2 == 0) {
        *devvec = 0;
      }
      else {
        devvec[uVar2] = devvec[uVar2 - 1] + 1;
      }
      iVar4 = *nchan;
    }
  }
  *ndev = iVar4;
  iVar1 = iVar4;
LAB_0016a32c:
  for (lVar3 = (long)iVar1; lVar3 < 4; lVar3 = lVar3 + 1) {
    devvec[lVar3] = -1;
  }
  for (lVar3 = (long)*nchan; lVar3 < 4; lVar3 = lVar3 + 1) {
    chanvec[lVar3] = 0;
  }
  return;
}

Assistant:

static void audio_make_sane(int *ndev, int *devvec,
    int *nchan, int *chanvec, int maxdev)
{
    int i;
    if (*ndev == -1)
    {           /* no input audio devices specified */
        if (*nchan == -1)
        {
            if (*ndev >= 1)
            {
                *nchan=1;
                chanvec[0] = SYS_DEFAULTCH;
                *ndev = 1;
                devvec[0] = DEFAULTAUDIODEV;
            }
            else *ndev = *nchan = 0;
        }
        else
        {
            for (i = 0; i < maxdev; i++)
                devvec[i] = i;
            *ndev = *nchan;
        }
    }
    else
    {
        if (*nchan == -1)
        {
            *nchan = *ndev;
            for (i = 0; i < *ndev; i++)
                chanvec[i] = SYS_DEFAULTCH;
        }
        else if (*nchan > *ndev)
        {
            for (i = *ndev; i < *nchan; i++)
            {
                if (i == 0)
                    devvec[0] = DEFAULTAUDIODEV;
                else devvec[i] = devvec[i-1] + 1;
            }
            *ndev = *nchan;
        }
        else if (*nchan < *ndev)
        {
            for (i = *nchan; i < *ndev; i++)
            {
                if (i == 0)
                    chanvec[0] = SYS_DEFAULTCH;
                else chanvec[i] = chanvec[i-1];
            }
            *ndev = *nchan;
        }
    }
    for (i = *ndev; i < maxdev; i++)
        devvec[i] = -1;
    for (i = *nchan; i < maxdev; i++)
        chanvec[i] = 0;

}